

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataType.cpp
# Opt level: O1

FeatureType __thiscall
CoreML::FeatureType::Dictionary(FeatureType *this,MLDictionaryFeatureTypeKeyType keyType)

{
  FeatureType *this_00;
  DictionaryFeatureType *pDVar1;
  runtime_error *this_01;
  StringFeatureType *this_02;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_02;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var2;
  FeatureType FVar3;
  
  FeatureType(this,MLFeatureTypeType_dictionaryType);
  this_00 = (this->m_type).
            super___shared_ptr<CoreML::Specification::FeatureType,_(__gnu_cxx::_Lock_policy)2>.
            _M_ptr;
  _Var2._M_pi = extraout_RDX;
  if (this_00->_oneof_case_[0] != 6) {
    Specification::FeatureType::clear_Type(this_00);
    this_00->_oneof_case_[0] = 6;
    pDVar1 = (DictionaryFeatureType *)operator_new(0x20);
    Specification::DictionaryFeatureType::DictionaryFeatureType(pDVar1);
    (this_00->Type_).dictionarytype_ = pDVar1;
    _Var2._M_pi = extraout_RDX_00;
  }
  pDVar1 = (this_00->Type_).dictionarytype_;
  if (keyType == MLDictionaryFeatureTypeKeyType_int64KeyType) {
    if (pDVar1->_oneof_case_[0] == 1) goto LAB_00528ac1;
    Specification::DictionaryFeatureType::clear_KeyType(pDVar1);
    pDVar1->_oneof_case_[0] = 1;
    this_02 = (StringFeatureType *)operator_new(0x18);
    Specification::Int64FeatureType::Int64FeatureType((Int64FeatureType *)this_02);
    _Var2._M_pi = extraout_RDX_02;
  }
  else {
    if (keyType != MLDictionaryFeatureTypeKeyType_stringKeyType) {
      if (keyType == MLDictionaryFeatureTypeKeyType_NOT_SET) {
        this_01 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error
                  (this_01,"Invalid dictionary key type. Expected one of: {int64, string}.");
        __cxa_throw(this_01,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      goto LAB_00528ac1;
    }
    if (pDVar1->_oneof_case_[0] == 2) goto LAB_00528ac1;
    Specification::DictionaryFeatureType::clear_KeyType(pDVar1);
    pDVar1->_oneof_case_[0] = 2;
    this_02 = (StringFeatureType *)operator_new(0x18);
    Specification::StringFeatureType::StringFeatureType(this_02);
    _Var2._M_pi = extraout_RDX_01;
  }
  (pDVar1->KeyType_).stringkeytype_ = this_02;
LAB_00528ac1:
  FVar3.m_type.super___shared_ptr<CoreML::Specification::FeatureType,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = _Var2._M_pi;
  FVar3.m_type.super___shared_ptr<CoreML::Specification::FeatureType,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)this;
  return (FeatureType)
         FVar3.m_type.
         super___shared_ptr<CoreML::Specification::FeatureType,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

FeatureType FeatureType::Dictionary(MLDictionaryFeatureTypeKeyType keyType) {
        FeatureType out(MLFeatureTypeType_dictionaryType);

        Specification::DictionaryFeatureType *params = out->mutable_dictionarytype();
        
        switch (keyType) {
            case MLDictionaryFeatureTypeKeyType_int64KeyType:
                params->mutable_int64keytype();
                break;
            case MLDictionaryFeatureTypeKeyType_stringKeyType:
                params->mutable_stringkeytype();
                break;
            case MLDictionaryFeatureTypeKeyType_NOT_SET:
                throw std::runtime_error("Invalid dictionary key type. Expected one of: {int64, string}.");
        }

        return out;
    }